

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::SourceRange>::
emplaceRealloc<slang::SourceLocation&,slang::SourceLocation&>
          (SmallVectorBase<slang::SourceRange> *this,pointer pos,SourceLocation *args,
          SourceLocation *args_1)

{
  ulong uVar1;
  SourceLocation SVar2;
  SourceLocation *pSVar3;
  SourceRange *__cur_1;
  pointer pSVar4;
  pointer pSVar5;
  pointer pSVar6;
  pointer pSVar7;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *pEVar8;
  long lVar9;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar8 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar1 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar1 * 2);
  if (pEVar8 < ctx) {
    pEVar8 = ctx;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    pEVar8 = (EVP_PKEY_CTX *)0x7ffffffffffffff;
  }
  lVar9 = (long)pos - (long)this->data_;
  pSVar4 = (pointer)operator_new((long)pEVar8 << 4);
  SVar2 = *args_1;
  *(SourceLocation *)((long)pSVar4 + lVar9) = *args;
  *(SourceLocation *)((long)pSVar4 + lVar9 + 8) = SVar2;
  pSVar7 = this->data_;
  pSVar5 = pSVar7 + this->len;
  pSVar6 = pSVar4;
  if (pSVar5 == pos) {
    for (; pSVar7 != pos; pSVar7 = pSVar7 + 1) {
      SVar2 = pSVar7->endLoc;
      pSVar6->startLoc = pSVar7->startLoc;
      pSVar6->endLoc = SVar2;
      pSVar6 = pSVar6 + 1;
    }
  }
  else {
    for (; pSVar7 != pos; pSVar7 = pSVar7 + 1) {
      SVar2 = pSVar7->endLoc;
      pSVar6->startLoc = pSVar7->startLoc;
      pSVar6->endLoc = SVar2;
      pSVar6 = pSVar6 + 1;
    }
    pSVar3 = (SourceLocation *)((long)pSVar4 + lVar9);
    for (; pos != pSVar5; pos = pos + 1) {
      SVar2 = pos->endLoc;
      pSVar3[2] = pos->startLoc;
      pSVar3[3] = SVar2;
      pSVar3 = pSVar3 + 2;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar8;
  this->data_ = pSVar4;
  return (pointer)((long)pSVar4 + lVar9);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}